

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O2

bool __thiscall chaiscript::parser::ChaiScript_Parser::Statements(ChaiScript_Parser *this)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  eval_error *peVar6;
  bool bVar7;
  allocator local_51;
  File_Position local_50;
  string local_48;
  
  bVar3 = true;
  bVar4 = false;
  do {
    while( true ) {
      bVar7 = bVar4;
      iVar1 = (this->m_position).line;
      iVar2 = (this->m_position).col;
      bVar4 = Def(this,false);
      local_50.line = iVar1;
      local_50.column = iVar2;
      if (!bVar4) break;
LAB_0015a2b6:
      bVar7 = !bVar3;
      bVar3 = true;
      bVar4 = true;
      if (bVar7) {
        peVar6 = (eval_error *)__cxa_allocate_exception(0x90);
        std::__cxx11::string::string
                  ((string *)&local_48,"Two function definitions missing line separator",&local_51);
        exception::eval_error::eval_error
                  (peVar6,&local_48,&local_50,
                   (this->m_filename).
                   super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
        __cxa_throw(peVar6,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
      }
    }
    bVar4 = Try(this);
    if (bVar4) goto LAB_0015a2b6;
    bVar4 = If(this);
    if (bVar4) goto LAB_0015a2b6;
    bVar4 = While(this);
    if (bVar4) goto LAB_0015a2b6;
    bVar4 = Class(this);
    if (bVar4) goto LAB_0015a2b6;
    bVar4 = For(this);
    if (bVar4) goto LAB_0015a2b6;
    bVar4 = Switch(this);
    if (bVar4) goto LAB_0015a2b6;
    bVar4 = Return(this);
    if (bVar4) {
LAB_0015a2f6:
      bVar7 = !bVar3;
      bVar3 = false;
      bVar4 = true;
      if (bVar7) {
        peVar6 = (eval_error *)__cxa_allocate_exception(0x90);
        std::__cxx11::string::string
                  ((string *)&local_48,"Two expressions missing line separator",&local_51);
        exception::eval_error::eval_error
                  (peVar6,&local_48,&local_50,
                   (this->m_filename).
                   super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
        __cxa_throw(peVar6,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
      }
    }
    else {
      bVar4 = Break(this);
      if (bVar4) goto LAB_0015a2f6;
      bVar4 = Continue(this);
      if (bVar4) goto LAB_0015a2f6;
      bVar4 = Equation(this);
      if (bVar4) goto LAB_0015a2f6;
      bVar5 = Block(this);
      bVar3 = true;
      bVar4 = true;
      if (!bVar5) {
        bVar5 = Eol(this);
        bVar3 = true;
        bVar4 = true;
        if (!bVar5) {
          return bVar7;
        }
      }
    }
  } while( true );
}

Assistant:

bool Statements() {
        bool retval = false;

        bool has_more = true;
        bool saw_eol = true;

        while (has_more) {
          const auto start = m_position;
          if (Def() || Try() || If() || While() || Class() || For() || Switch()) {
            if (!saw_eol) {
              throw exception::eval_error("Two function definitions missing line separator", File_Position(start.line, start.col), *m_filename);
            }
            has_more = true;
            retval = true;
            saw_eol = true;
          }
          else if (Return() || Break() || Continue() || Equation()) {
            if (!saw_eol) {
              throw exception::eval_error("Two expressions missing line separator", File_Position(start.line, start.col), *m_filename);
            }
            has_more = true;
            retval = true;
            saw_eol = false;
          }
          else if (Block() || Eol()) {
            has_more = true;
            retval = true;
            saw_eol = true;
          }
          else {
            has_more = false;
          }
        }

        return retval;
      }